

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

bool ActionMarkImplied::checkImpliedCover(Funcdata *data,Varnode *vn)

{
  PcodeOp *pPVar1;
  PcodeOp *pPVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  pointer ppFVar5;
  Varnode *a;
  bool bVar6;
  bool bVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  Cover *pCVar10;
  HighVariable *high;
  long lVar11;
  long lVar12;
  
  pPVar1 = vn->def;
  if (pPVar1->opcode->opcode == CPUI_LOAD) {
    cVar8 = PcodeOpBank::end(&data->obank,CPUI_STORE);
    for (cVar9 = PcodeOpBank::begin(&data->obank,CPUI_STORE); cVar9._M_node != cVar8._M_node;
        cVar9._M_node = (cVar9._M_node)->_M_next) {
      pPVar2 = (PcodeOp *)cVar9._M_node[1]._M_next;
      if ((pPVar2->flags & 0x20) == 0) {
        pCVar10 = Varnode::getCover(vn);
        bVar6 = Cover::contain(pCVar10,pPVar2,2);
        if (bVar6) {
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppVVar4 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((((*ppVVar3)->loc).offset == ((*ppVVar4)->loc).offset) &&
             (bVar6 = isPossibleAlias(ppVVar3[1],ppVVar4[1],2), bVar6)) goto LAB_0030fb01;
        }
      }
    }
  }
  if (((pPVar1->flags & 4) == 0) && (pPVar1->opcode->opcode != CPUI_LOAD)) {
LAB_0030fb14:
    lVar12 = 0;
    while( true ) {
      ppVVar3 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar11 = (long)(int)((ulong)((long)(pPVar1->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3)
                          >> 3);
      bVar6 = lVar11 <= lVar12;
      if (lVar11 <= lVar12) break;
      a = ppVVar3[lVar12];
      if ((a->flags & 2) == 0) {
        high = Varnode::getHigh(vn);
        bVar7 = Merge::inflateTest(&data->covermerge,a,high);
        if (bVar7) {
          return bVar6;
        }
      }
      lVar12 = lVar12 + 1;
    }
  }
  else {
    lVar12 = 0;
    do {
      ppFVar5 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(data->qlst).
                              super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5) >> 3) <=
          lVar12) goto LAB_0030fb14;
      pPVar2 = ppFVar5[lVar12]->op;
      pCVar10 = Varnode::getCover(vn);
      bVar6 = Cover::contain(pCVar10,pPVar2,2);
      lVar12 = lVar12 + 1;
    } while (!bVar6);
LAB_0030fb01:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ActionMarkImplied::checkImpliedCover(Funcdata &data,Varnode *vn)

{
  PcodeOp *op,*storeop,*callop;
  Varnode *defvn;
  int4 i;

  op = vn->getDef();
  if (op->code() == CPUI_LOAD) { // Check for loads crossing stores
    list<PcodeOp *>::const_iterator oiter,iterend;
    iterend = data.endOp(CPUI_STORE);
    for(oiter=data.beginOp(CPUI_STORE);oiter!=iterend;++oiter) {
      storeop = *oiter;
      if (storeop->isDead()) continue;
      if (vn->getCover()->contain(storeop,2)) {
				// The LOAD crosses a STORE. We are cavalier
				// and let it through unless we can verify
				// that the pointers are actually the same
	if (storeop->getIn(0)->getOffset() == op->getIn(0)->getOffset()) {
	  //	  if (!functionalDifference(storeop->getIn(1),op->getIn(1),2)) return false;
	  if (isPossibleAlias(storeop->getIn(1),op->getIn(1),2)) return false;
	}
      }
    }
  }
  if (op->isCall() || (op->code() == CPUI_LOAD)) { // loads crossing calls
    for(i=0;i<data.numCalls();++i) {
      callop = data.getCallSpecs(i)->getOp();
      if (vn->getCover()->contain(callop,2)) return false;
    }
  }
  for(i=0;i<op->numInput();++i) {
    defvn = op->getIn(i);
    if (defvn->isConstant()) continue;
    if (data.getMerge().inflateTest(defvn,vn->getHigh()))	// Test for intersection
      return false;
  }
  return true;
}